

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

FieldEntry *
google::protobuf::internal::TcParser::FindFieldEntry(TcParseTableBase *table,uint32_t field_num)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  FieldEntry *in_RAX;
  uint uVar4;
  long lVar5;
  uint *puVar6;
  uint *puVar7;
  
  lVar5 = (long)&table->has_bits_offset + (ulong)table->field_entries_offset;
  uVar4 = field_num - 1;
  if (uVar4 < 0x20) {
    if ((table->skipmap32 >> (uVar4 & 0x1f) & 1) == 0) {
      if (lVar5 == 0) {
        protobuf_assumption_failed
                  ("entry != nullptr",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                   ,0x109);
      }
      uVar2 = table->skipmap32 & (1 << ((byte)uVar4 & 0x1f)) - 1U;
      uVar2 = uVar2 - (uVar2 >> 1 & 0x55555555);
      uVar2 = (uVar2 >> 2 & 0x33333333) + (uVar2 & 0x33333333);
      in_RAX = (FieldEntry *)
               (lVar5 + (ulong)(uVar4 - (((uVar2 >> 4) + uVar2 & 0xf0f0f0f) * 0x1010101 >> 0x18)) *
                        0xc);
    }
    else {
      in_RAX = (FieldEntry *)0x0;
    }
  }
  else {
    puVar7 = (uint *)((long)&table->has_bits_offset + (ulong)table->lookup_table_offset);
    do {
      puVar6 = (uint *)((long)puVar7 + 6);
      if (field_num < *puVar7) {
LAB_00441fb9:
        bVar1 = false;
        in_RAX = (FieldEntry *)0x0;
      }
      else {
        uVar4 = field_num - *puVar7 >> 4;
        if (uVar4 < (ushort)puVar7[1]) {
          uVar2 = field_num - *puVar7 & 0xf;
          if (((ushort)puVar6[uVar4] >> uVar2 & 1) != 0) goto LAB_00441fb9;
          if (lVar5 == 0) {
            protobuf_assumption_failed
                      ("entry != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                       ,0x127);
          }
          uVar3 = (1 << (sbyte)uVar2) - 1U & (uint)(ushort)puVar6[uVar4];
          uVar3 = uVar3 - (uVar3 >> 1 & 0x5555);
          uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
          in_RAX = (FieldEntry *)
                   (lVar5 + (ulong)((uVar2 - (((uVar3 >> 4) + uVar3 & 0xf0f0f0f) * 0x1010101 >> 0x18
                                             )) +
                                   (uint)*(ushort *)((long)puVar7 + (ulong)(uVar4 * 2) * 2 + 8)) *
                            0xc);
          bVar1 = false;
        }
        else {
          puVar6 = puVar6 + (uint)(ushort)puVar7[1];
          bVar1 = true;
        }
      }
      puVar7 = puVar6;
    } while (bVar1);
  }
  return in_RAX;
}

Assistant:

const TcParseTableBase::FieldEntry* TcParser::FindFieldEntry(
    const TcParseTableBase* table, uint32_t field_num) {
  const FieldEntry* const field_entries = table->field_entries_begin();

  uint32_t fstart = 1;
  uint32_t adj_fnum = field_num - fstart;

  if (ABSL_PREDICT_TRUE(adj_fnum < 32)) {
    uint32_t skipmap = table->skipmap32;
    uint32_t skipbit = 1 << adj_fnum;
    if (ABSL_PREDICT_FALSE(skipmap & skipbit)) return nullptr;
    skipmap &= skipbit - 1;
    adj_fnum -= absl::popcount(skipmap);
    auto* entry = field_entries + adj_fnum;
    PROTOBUF_ASSUME(entry != nullptr);
    return entry;
  }
  const uint16_t* lookup_table = table->field_lookup_begin();
  for (;;) {
#ifdef ABSL_IS_LITTLE_ENDIAN
    memcpy(&fstart, lookup_table, sizeof(fstart));
#else
    fstart = lookup_table[0] | (lookup_table[1] << 16);
#endif
    lookup_table += sizeof(fstart) / sizeof(*lookup_table);
    uint32_t num_skip_entries = *lookup_table++;
    if (field_num < fstart) return nullptr;
    adj_fnum = field_num - fstart;
    uint32_t skip_num = adj_fnum / 16;
    if (ABSL_PREDICT_TRUE(skip_num < num_skip_entries)) {
      // for each group of 16 fields we have:
      // a bitmap of 16 bits
      // a 16-bit field-entry offset for the first of them.
      auto* skip_data = lookup_table + (adj_fnum / 16) * (sizeof(SkipEntry16) /
                                                          sizeof(uint16_t));
      SkipEntry16 se = {skip_data[0], skip_data[1]};
      adj_fnum &= 15;
      uint32_t skipmap = se.skipmap;
      uint16_t skipbit = 1 << adj_fnum;
      if (ABSL_PREDICT_FALSE(skipmap & skipbit)) return nullptr;
      skipmap &= skipbit - 1;
      adj_fnum += se.field_entry_offset;
      adj_fnum -= absl::popcount(skipmap);
      auto* entry = field_entries + adj_fnum;
      PROTOBUF_ASSUME(entry != nullptr);
      return entry;
    }
    lookup_table +=
        num_skip_entries * (sizeof(SkipEntry16) / sizeof(*lookup_table));
  }
}